

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O1

void __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::on<void(*)(),boost::ext::ut::v1_1_8::none>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *this,
          test<void_(*)(),_boost::ext::ut::v1_1_8::none> *test)

{
  anon_struct_16_2_3fa459c6_for_asserts_ *paVar1;
  size_t *psVar2;
  long lVar3;
  string_view *psVar4;
  size_t sVar5;
  bool bVar6;
  test_end tVar7;
  reporter<boost::ext::ut::v1_1_8::printer> *prVar8;
  reporter<boost::ext::ut::v1_1_8::printer> *prVar9;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *prVar10;
  bool bVar11;
  uint uVar12;
  basic_string_view<char,_std::char_traits<char>_> *ftag;
  string_view *psVar13;
  ulong uVar14;
  char *pcVar15;
  undefined1 *puVar16;
  pointer psVar17;
  bool bVar18;
  bool bVar19;
  string_view input;
  string_view input_00;
  string_view pattern;
  char local_79;
  test<void_(*)(),_boost::ext::ut::v1_1_8::none> *local_78;
  reporter<boost::ext::ut::v1_1_8::printer> *local_70;
  runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16> *local_68;
  pointer local_60;
  char *local_58;
  unsigned_long uStack_50;
  char *pcStack_48;
  unsigned_long uStack_40;
  
  pcVar15 = (test->name).data_;
  lVar3 = *(long *)(this + 0x200);
  *(unsigned_long *)(this + lVar3 * 0x10 + 0x218) = (test->name).size_;
  *(char **)(this + lVar3 * 0x10 + 0x220) = pcVar15;
  psVar17 = (test->tag).
            super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (test->tag).
             super__Vector_base<boost::ext::ut::v1_1_8::utility::string_view,_std::allocator<boost::ext::ut::v1_1_8::utility::string_view>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  bVar18 = psVar17 == local_60;
  local_78 = test;
  local_70 = (reporter<boost::ext::ut::v1_1_8::printer> *)this;
  bVar19 = bVar18;
  if (!bVar18) {
    local_68 = this + 0x70;
    bVar6 = bVar18;
    do {
      prVar9 = local_70;
      input._M_str = psVar17->data_;
      input._M_len = psVar17->size_;
      pattern._M_str = "skip";
      pattern._M_len = 4;
      bVar11 = utility::is_match(input,pattern);
      prVar10 = local_68;
      if (bVar11) {
        std::ostream::write((char *)local_68,(long)(local_78->name).data_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)prVar10,"...SKIPPED\n",0xb);
        psVar2 = &(prVar9->tests_).skip;
        *psVar2 = *psVar2 + 1;
      }
      else {
        psVar4 = *(string_view **)&prVar9[1].printer_.field_0x120;
        for (psVar13 = *(string_view **)&prVar9[1].printer_.field_0x118; psVar13 != psVar4;
            psVar13 = psVar13 + 1) {
          input_00._M_str = psVar17->data_;
          input_00._M_len = psVar17->size_;
          bVar18 = utility::is_match(input_00,*psVar13);
          if (bVar18) {
            bVar18 = true;
            bVar6 = bVar18;
            break;
          }
          bVar18 = bVar6;
        }
      }
      if (bVar11) break;
      psVar17 = psVar17 + 1;
      bVar19 = psVar17 == local_60;
    } while (!bVar19);
  }
  prVar9 = local_70;
  if (bVar19) {
    if (bVar18) {
      prVar8 = local_70 + 1;
      bVar18 = filter::operator()(&local_70[1].printer_.field_0x100,local_70[1].asserts_.pass,
                                  (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>
                                   *)&prVar8->printer_);
      if (bVar18) {
        sVar5 = prVar9[1].asserts_.pass;
        prVar9[1].asserts_.pass = sVar5 + 1;
        puVar16 = &(prVar9->printer_).field_0x40;
        pcVar15 = (local_78->name).data_;
        if (sVar5 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar16,"Running \"",9);
          std::ostream::write(puVar16,(long)pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar16,"\"...",4);
          prVar9->fails_ = (prVar9->asserts_).fail;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar16,"\n \"",3);
          std::ostream::write(puVar16,(long)pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar16,"\"...",4);
        }
        if (prVar9[1].printer_.field_0x130 == '\x01') {
          if (prVar9[1].asserts_.pass != 0) {
            uVar12 = 1;
            uVar14 = 0;
            do {
              pcVar15 = "";
              if (uVar12 != 1) {
                pcVar15 = ".";
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,pcVar15,(ulong)(uVar12 != 1));
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(&prVar9[1].printer_.colors_.none)[uVar14]._M_str,
                         (&(prVar8->printer_).colors_.none)[uVar14]._M_len);
              uVar14 = (ulong)uVar12;
              uVar12 = uVar12 + 1;
            } while (uVar14 < prVar9[1].asserts_.pass);
          }
          local_79 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_79,1);
        }
        (*local_78->run)();
        paVar1 = &prVar9[1].asserts_;
        paVar1->pass = paVar1->pass - 1;
        if (paVar1->pass == 0) {
          local_58 = (local_78->type).data_;
          uStack_50 = (local_78->type).size_;
          pcStack_48 = (local_78->name).data_;
          uStack_40 = (local_78->name).size_;
          tVar7.type = local_78->type;
          tVar7.name = local_78->name;
          reporter<boost::ext::ut::v1_1_8::printer>::on(prVar9,tVar7);
        }
      }
    }
    else {
      puVar16 = &(local_70->printer_).field_0x40;
      std::ostream::write(puVar16,(long)(local_78->name).data_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar16,"...SKIPPED\n",0xb);
      psVar2 = &(prVar9->tests_).skip;
      *psVar2 = *psVar2 + 1;
    }
  }
  return;
}

Assistant:

auto on(events::test<Ts...> test) {
      path_[level_] = test.name;

      auto execute = std::empty(test.tag);
      for (const auto& tag : test.tag) {
        if (utility::is_match(tag, "skip")) {
          on(events::skip<>{.type = test.type, .name = test.name});
          return;
        }

        for (const auto& ftag : tag_) {
          if (utility::is_match(tag, ftag)) {
            execute = true;
            break;
          }
        }
      }

      if (not execute) {
        on(events::skip<>{.type = test.type, .name = test.name});
        return;
      }

      if (filter_(level_, path_)) {
        if (not level_++) {
          reporter_.on(events::test_begin{
              .type = test.type, .name = test.name, .location = test.location});
        } else {
          reporter_.on(events::test_run{.type = test.type, .name = test.name});
        }

        if (dry_run_) {
          for (auto i = 0u; i < level_; ++i) {
            std::cout << (i ? "." : "") << path_[i];
          }
          std::cout << '\n';
        }

#if defined(__cpp_exceptions)
        try {
#endif
          test();
#if defined(__cpp_exceptions)
        } catch (const events::fatal_assertion&) {
        } catch (const std::exception& exception) {
          ++fails_;
          reporter_.on(events::exception{exception.what()});
        } catch (...) {
          ++fails_;
          reporter_.on(events::exception{"Unknown exception"});
        }
#endif

        if (not--level_) {
          reporter_.on(events::test_end{.type = test.type, .name = test.name});
        }
      }
    }